

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

string * __thiscall
CppGenerator::genTestFunction_abi_cxx11_(string *__return_storage_ptr__,CppGenerator *this)

{
  bool bVar1;
  long lVar2;
  char cVar3;
  undefined8 *puVar4;
  long *plVar5;
  size_t sVar6;
  View *pVVar7;
  Attribute *pAVar8;
  undefined8 *puVar9;
  ulong *puVar10;
  size_type *psVar11;
  ulong uVar12;
  long *plVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  char cVar15;
  ulong uVar16;
  string *returnString;
  string __str;
  string fields;
  ulong *local_300;
  long local_2f8;
  ulong local_2f0;
  long lStack_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  long *local_2c0;
  long local_2b8;
  long local_2b0;
  long lStack_2a8;
  ulong *local_2a0;
  long local_298;
  ulong local_290;
  long lStack_288;
  ulong *local_280;
  long local_278;
  ulong local_270;
  long lStack_268;
  CppGenerator *local_260;
  undefined8 *local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  undefined8 *local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 *local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8;
  long lStack_1a0;
  ulong *local_198;
  long local_190;
  ulong local_188;
  long lStack_180;
  ulong *local_178;
  long local_170;
  ulong local_168;
  long lStack_160;
  ulong *local_158;
  long local_150;
  ulong local_148;
  long lStack_140;
  ulong *local_138;
  long local_130;
  ulong local_128;
  long lStack_120;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  ulong local_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_260 = this;
  local_158 = &local_148;
  std::__cxx11::string::_M_construct((ulong)&local_158,'\x03');
  puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,0x2afca7);
  puVar9 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar9) {
    local_1e8 = *puVar9;
    uStack_1e0 = puVar4[3];
    local_1f8 = &local_1e8;
  }
  else {
    local_1e8 = *puVar9;
    local_1f8 = (undefined8 *)*puVar4;
  }
  local_1f0 = puVar4[1];
  *puVar4 = puVar9;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  local_280 = &local_270;
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_270 = *puVar10;
    lStack_268 = plVar5[3];
  }
  else {
    local_270 = *puVar10;
    local_280 = (ulong *)*plVar5;
  }
  local_278 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_178 = &local_168;
  std::__cxx11::string::_M_construct((ulong)&local_178,'\x03');
  uVar16 = 0xf;
  if (local_280 != &local_270) {
    uVar16 = local_270;
  }
  if (uVar16 < (ulong)(local_170 + local_278)) {
    uVar16 = 0xf;
    if (local_178 != &local_168) {
      uVar16 = local_168;
    }
    if (uVar16 < (ulong)(local_170 + local_278)) goto LAB_00226c82;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_280);
  }
  else {
LAB_00226c82:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_178);
  }
  local_258 = &local_248;
  puVar9 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar9) {
    local_248 = *puVar9;
    uStack_240 = puVar4[3];
  }
  else {
    local_248 = *puVar9;
    local_258 = (undefined8 *)*puVar4;
  }
  local_250 = puVar4[1];
  *puVar4 = puVar9;
  puVar4[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_2f0 = *puVar10;
    lStack_2e8 = plVar5[3];
    local_300 = &local_2f0;
  }
  else {
    local_2f0 = *puVar10;
    local_300 = (ulong *)*plVar5;
  }
  local_2f8 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_198 = &local_188;
  std::__cxx11::string::_M_construct((ulong)&local_198,'\x06');
  uVar16 = 0xf;
  if (local_300 != &local_2f0) {
    uVar16 = local_2f0;
  }
  if (uVar16 < (ulong)(local_190 + local_2f8)) {
    uVar16 = 0xf;
    if (local_198 != &local_188) {
      uVar16 = local_188;
    }
    if (uVar16 < (ulong)(local_190 + local_2f8)) goto LAB_00226dc5;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_300);
  }
  else {
LAB_00226dc5:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_198);
  }
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  psVar11 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_2e0.field_2._M_allocated_capacity = *psVar11;
    local_2e0.field_2._8_8_ = puVar4[3];
  }
  else {
    local_2e0.field_2._M_allocated_capacity = *psVar11;
    local_2e0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_2e0._M_string_length = puVar4[1];
  *puVar4 = psVar11;
  puVar4[1] = 0;
  *(undefined1 *)psVar11 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2e0);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_290 = *puVar10;
    lStack_288 = plVar5[3];
    local_2a0 = &local_290;
  }
  else {
    local_290 = *puVar10;
    local_2a0 = (ulong *)*plVar5;
  }
  local_298 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_1b8 = &local_1a8;
  std::__cxx11::string::_M_construct((ulong)&local_1b8,'\x06');
  uVar16 = 0xf;
  if (local_2a0 != &local_290) {
    uVar16 = local_290;
  }
  if (uVar16 < (ulong)(local_1b0 + local_298)) {
    uVar16 = 0xf;
    if (local_1b8 != &local_1a8) {
      uVar16 = local_1a8;
    }
    if (uVar16 < (ulong)(local_1b0 + local_298)) goto LAB_00226f03;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_2a0);
  }
  else {
LAB_00226f03:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_1b8);
  }
  local_2c0 = &local_2b0;
  plVar5 = puVar4 + 2;
  if ((long *)*puVar4 == plVar5) {
    local_2b0 = *plVar5;
    lStack_2a8 = puVar4[3];
  }
  else {
    local_2b0 = *plVar5;
    local_2c0 = (long *)*puVar4;
  }
  local_2b8 = puVar4[1];
  *puVar4 = plVar5;
  puVar4[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar11 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar11) {
    lVar2 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  uVar16 = 0;
  while( true ) {
    paVar14 = &local_2e0.field_2;
    sVar6 = QueryCompiler::numberOfViews
                      ((local_260->_qc).
                       super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (sVar6 <= uVar16) break;
    pVVar7 = QueryCompiler::getView
                       ((local_260->_qc).
                        super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,uVar16)
    ;
    if (pVVar7->_origin == pVVar7->_destination) {
      local_2c0 = &local_2b0;
      local_f8 = uVar16;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"");
      uVar16 = 0;
      do {
        if (((pVVar7->_fVars).super__Base_bitset<2UL>._M_w[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0
           ) {
          pAVar8 = TreeDecomposition::getAttribute
                             ((local_260->_td).
                              super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,uVar16);
          std::operator+(&local_2e0," << tuple.",&pAVar8->_name);
          puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
          puVar10 = puVar4 + 2;
          if ((ulong *)*puVar4 == puVar10) {
            local_290 = *puVar10;
            lStack_288 = puVar4[3];
            local_2a0 = &local_290;
          }
          else {
            local_290 = *puVar10;
            local_2a0 = (ulong *)*puVar4;
          }
          local_298 = puVar4[1];
          *puVar4 = puVar10;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_2a0);
          if (local_2a0 != &local_290) {
            operator_delete(local_2a0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != paVar14) {
            operator_delete(local_2e0._M_dataplus._M_p);
          }
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != 100);
      if ((pVVar7->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (pVVar7->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar16 = 0;
        do {
          cVar15 = '\x01';
          if (9 < uVar16) {
            uVar12 = uVar16;
            cVar3 = '\x04';
            do {
              cVar15 = cVar3;
              if (uVar12 < 100) {
                cVar15 = cVar15 + -2;
                goto LAB_00227259;
              }
              if (uVar12 < 1000) {
                cVar15 = cVar15 + -1;
                goto LAB_00227259;
              }
              if (uVar12 < 10000) goto LAB_00227259;
              bVar1 = 99999 < uVar12;
              uVar12 = uVar12 / 10000;
              cVar3 = cVar15 + '\x04';
            } while (bVar1);
            cVar15 = cVar15 + '\x01';
          }
LAB_00227259:
          local_300 = &local_2f0;
          std::__cxx11::string::_M_construct((ulong)&local_300,cVar15);
          std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_300,(uint)local_2f8,uVar16)
          ;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x2b1923);
          psVar11 = puVar4 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_2e0.field_2._M_allocated_capacity = *psVar11;
            local_2e0.field_2._8_8_ = puVar4[3];
            local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
          }
          else {
            local_2e0.field_2._M_allocated_capacity = *psVar11;
            local_2e0._M_dataplus._M_p = (pointer)*puVar4;
          }
          local_2e0._M_string_length = puVar4[1];
          *puVar4 = psVar11;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
          puVar10 = puVar4 + 2;
          if ((ulong *)*puVar4 == puVar10) {
            local_290 = *puVar10;
            lStack_288 = puVar4[3];
            local_2a0 = &local_290;
          }
          else {
            local_290 = *puVar10;
            local_2a0 = (ulong *)*puVar4;
          }
          local_298 = puVar4[1];
          *puVar4 = puVar10;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_2a0);
          if (local_2a0 != &local_290) {
            operator_delete(local_2a0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p);
          }
          if (local_300 != &local_2f0) {
            operator_delete(local_300);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < (ulong)((long)(pVVar7->_aggregates).
                                        super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pVVar7->_aggregates).
                                        super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      std::__cxx11::string::pop_back();
      std::__cxx11::string::pop_back();
      std::__cxx11::string::pop_back();
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,'\x06');
      plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
      uVar16 = local_f8;
      local_218 = &local_208;
      plVar13 = plVar5 + 2;
      if ((long *)*plVar5 == plVar13) {
        local_208 = *plVar13;
        lStack_200 = plVar5[3];
      }
      else {
        local_208 = *plVar13;
        local_218 = (long *)*plVar5;
      }
      local_210 = plVar5[1];
      *plVar5 = (long)plVar13;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_218,
                                  (ulong)local_260->viewName[local_f8]._M_dataplus._M_p);
      local_70 = &local_60;
      plVar13 = plVar5 + 2;
      if ((long *)*plVar5 == plVar13) {
        local_60 = *plVar13;
        lStack_58 = plVar5[3];
      }
      else {
        local_60 = *plVar13;
        local_70 = (long *)*plVar5;
      }
      local_68 = plVar5[1];
      *plVar5 = (long)plVar13;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_138 = &local_128;
      puVar10 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar10) {
        local_128 = *puVar10;
        lStack_120 = plVar5[3];
      }
      else {
        local_128 = *puVar10;
        local_138 = (ulong *)*plVar5;
      }
      local_130 = plVar5[1];
      *plVar5 = (long)puVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_90 = local_80;
      std::__cxx11::string::_M_construct((ulong)&local_90,'\x06');
      uVar12 = 0xf;
      if (local_138 != &local_128) {
        uVar12 = local_128;
      }
      if (uVar12 < (ulong)(local_88 + local_130)) {
        uVar12 = 0xf;
        if (local_90 != local_80) {
          uVar12 = local_80[0];
        }
        if (uVar12 < (ulong)(local_88 + local_130)) goto LAB_002275c7;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_138);
      }
      else {
LAB_002275c7:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_90);
      }
      local_238 = &local_228;
      puVar9 = puVar4 + 2;
      if ((undefined8 *)*puVar4 == puVar9) {
        local_228 = *puVar9;
        uStack_220 = puVar4[3];
      }
      else {
        local_228 = *puVar9;
        local_238 = (undefined8 *)*puVar4;
      }
      local_230 = puVar4[1];
      *puVar4 = puVar9;
      puVar4[1] = 0;
      *(undefined1 *)puVar9 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_118 = &local_108;
      puVar10 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar10) {
        local_108 = *puVar10;
        lStack_100 = plVar5[3];
      }
      else {
        local_108 = *puVar10;
        local_118 = (ulong *)*plVar5;
      }
      local_110 = plVar5[1];
      *plVar5 = (long)puVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct((ulong)&local_b0,'\t');
      uVar12 = 0xf;
      if (local_118 != &local_108) {
        uVar12 = local_108;
      }
      if (uVar12 < (ulong)(local_a8 + local_110)) {
        uVar12 = 0xf;
        if (local_b0 != local_a0) {
          uVar12 = local_a0[0];
        }
        if (uVar12 < (ulong)(local_a8 + local_110)) goto LAB_00227730;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_118);
      }
      else {
LAB_00227730:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_b0);
      }
      local_1d8 = &local_1c8;
      puVar9 = puVar4 + 2;
      if ((undefined8 *)*puVar4 == puVar9) {
        local_1c8 = *puVar9;
        uStack_1c0 = puVar4[3];
      }
      else {
        local_1c8 = *puVar9;
        local_1d8 = (undefined8 *)*puVar4;
      }
      local_1d0 = puVar4[1];
      *puVar4 = puVar9;
      puVar4[1] = 0;
      *(undefined1 *)puVar9 = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1d8,
                                  (ulong)local_260->viewName[uVar16]._M_dataplus._M_p);
      local_1b8 = &local_1a8;
      puVar10 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar10) {
        local_1a8 = *puVar10;
        lStack_1a0 = plVar5[3];
      }
      else {
        local_1a8 = *puVar10;
        local_1b8 = (ulong *)*plVar5;
      }
      local_1b0 = plVar5[1];
      *plVar5 = (long)puVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_1b8);
      local_198 = &local_188;
      puVar10 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar10) {
        local_188 = *puVar10;
        lStack_180 = plVar5[3];
      }
      else {
        local_188 = *puVar10;
        local_198 = (ulong *)*plVar5;
      }
      local_190 = plVar5[1];
      *plVar5 = (long)puVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_198,
                                  (ulong)local_260->viewName[uVar16]._M_dataplus._M_p);
      uVar16 = local_f8;
      local_178 = &local_168;
      puVar10 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar10) {
        local_168 = *puVar10;
        lStack_160 = plVar5[3];
      }
      else {
        local_168 = *puVar10;
        local_178 = (ulong *)*plVar5;
      }
      local_170 = plVar5[1];
      *plVar5 = (long)puVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_178);
      puVar10 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar10) {
        local_148 = *puVar10;
        lStack_140 = plVar5[3];
        local_158 = &local_148;
      }
      else {
        local_148 = *puVar10;
        local_158 = (ulong *)*plVar5;
      }
      local_150 = plVar5[1];
      *plVar5 = (long)puVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_d0 = local_c0;
      std::__cxx11::string::_M_construct((ulong)&local_d0,'\t');
      uVar12 = 0xf;
      if (local_158 != &local_148) {
        uVar12 = local_148;
      }
      if (uVar12 < (ulong)(local_c8 + local_150)) {
        uVar12 = 0xf;
        if (local_d0 != local_c0) {
          uVar12 = local_c0[0];
        }
        if (uVar12 < (ulong)(local_c8 + local_150)) goto LAB_002279ef;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_158);
      }
      else {
LAB_002279ef:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_d0);
      }
      local_1f8 = &local_1e8;
      puVar9 = puVar4 + 2;
      if ((undefined8 *)*puVar4 == puVar9) {
        local_1e8 = *puVar9;
        uStack_1e0 = puVar4[3];
      }
      else {
        local_1e8 = *puVar9;
        local_1f8 = (undefined8 *)*puVar4;
      }
      local_1f0 = puVar4[1];
      *puVar4 = puVar9;
      puVar4[1] = 0;
      *(undefined1 *)puVar9 = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f8);
      local_280 = &local_270;
      puVar10 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar10) {
        local_270 = *puVar10;
        lStack_268 = puVar4[3];
      }
      else {
        local_270 = *puVar10;
        local_280 = (ulong *)*puVar4;
      }
      local_278 = puVar4[1];
      *puVar4 = puVar10;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_2c0);
      local_258 = &local_248;
      puVar9 = puVar4 + 2;
      if ((undefined8 *)*puVar4 == puVar9) {
        local_248 = *puVar9;
        uStack_240 = puVar4[3];
      }
      else {
        local_248 = *puVar9;
        local_258 = (undefined8 *)*puVar4;
      }
      local_250 = puVar4[1];
      *puVar4 = puVar9;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
      local_300 = &local_2f0;
      puVar10 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar10) {
        local_2f0 = *puVar10;
        lStack_2e8 = puVar4[3];
      }
      else {
        local_2f0 = *puVar10;
        local_300 = (ulong *)*puVar4;
      }
      local_2f8 = puVar4[1];
      *puVar4 = puVar10;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      local_f0 = local_e0;
      std::__cxx11::string::_M_construct((ulong)&local_f0,'\x06');
      uVar12 = 0xf;
      if (local_300 != &local_2f0) {
        uVar12 = local_2f0;
      }
      if (uVar12 < (ulong)(local_e8 + local_2f8)) {
        uVar12 = 0xf;
        if (local_f0 != local_e0) {
          uVar12 = local_e0[0];
        }
        if (uVar12 < (ulong)(local_e8 + local_2f8)) goto LAB_00227c12;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_300);
      }
      else {
LAB_00227c12:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_f0);
      }
      psVar11 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_2e0.field_2._M_allocated_capacity = *psVar11;
        local_2e0.field_2._8_8_ = puVar4[3];
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      }
      else {
        local_2e0.field_2._M_allocated_capacity = *psVar11;
        local_2e0._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_2e0._M_string_length = puVar4[1];
      *puVar4 = psVar11;
      puVar4[1] = 0;
      *(undefined1 *)psVar11 = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
      puVar10 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar10) {
        local_290 = *puVar10;
        lStack_288 = puVar4[3];
        local_2a0 = &local_290;
      }
      else {
        local_290 = *puVar10;
        local_2a0 = (ulong *)*puVar4;
      }
      local_298 = puVar4[1];
      *puVar4 = puVar10;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_2a0);
      if (local_2a0 != &local_290) {
        operator_delete(local_2a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      if (local_f0 != local_e0) {
        operator_delete(local_f0);
      }
      if (local_300 != &local_2f0) {
        operator_delete(local_300);
      }
      if (local_258 != &local_248) {
        operator_delete(local_258);
      }
      if (local_280 != &local_270) {
        operator_delete(local_280);
      }
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8);
      }
      if (local_d0 != local_c0) {
        operator_delete(local_d0);
      }
      if (local_158 != &local_148) {
        operator_delete(local_158);
      }
      if (local_178 != &local_168) {
        operator_delete(local_178);
      }
      if (local_198 != &local_188) {
        operator_delete(local_198);
      }
      if (local_1b8 != &local_1a8) {
        operator_delete(local_1b8);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8);
      }
      if (local_b0 != local_a0) {
        operator_delete(local_b0);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118);
      }
      if (local_238 != &local_228) {
        operator_delete(local_238);
      }
      if (local_90 != local_80) {
        operator_delete(local_90);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_218 != &local_208) {
        operator_delete(local_218);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (local_2c0 != &local_2b0) {
        operator_delete(local_2c0);
      }
    }
    uVar16 = uVar16 + 1;
  }
  local_258 = &local_248;
  std::__cxx11::string::_M_construct((ulong)&local_258,'\x06');
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_2f0 = *puVar10;
    lStack_2e8 = plVar5[3];
    local_300 = &local_2f0;
  }
  else {
    local_2f0 = *puVar10;
    local_300 = (ulong *)*plVar5;
  }
  local_2f8 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_280 = &local_270;
  std::__cxx11::string::_M_construct((ulong)&local_280,'\x03');
  uVar16 = 0xf;
  if (local_300 != &local_2f0) {
    uVar16 = local_2f0;
  }
  if (uVar16 < (ulong)(local_278 + local_2f8)) {
    uVar16 = 0xf;
    if (local_280 != &local_270) {
      uVar16 = local_270;
    }
    if ((ulong)(local_278 + local_2f8) <= uVar16) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_280,0,(char *)0x0,(ulong)local_300);
      goto LAB_00228007;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_280);
LAB_00228007:
  psVar11 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_2e0.field_2._M_allocated_capacity = *psVar11;
    local_2e0.field_2._8_8_ = puVar4[3];
    local_2e0._M_dataplus._M_p = (pointer)paVar14;
  }
  else {
    local_2e0.field_2._M_allocated_capacity = *psVar11;
    local_2e0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_2e0._M_string_length = puVar4[1];
  *puVar4 = psVar11;
  puVar4[1] = 0;
  *(undefined1 *)psVar11 = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
  puVar10 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar10) {
    local_290 = *puVar10;
    lStack_288 = puVar4[3];
    local_2a0 = &local_290;
  }
  else {
    local_290 = *puVar10;
    local_2a0 = (ulong *)*puVar4;
  }
  local_298 = puVar4[1];
  *puVar4 = puVar10;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2a0);
  local_2c0 = &local_2b0;
  plVar13 = plVar5 + 2;
  if ((long *)*plVar5 == plVar13) {
    local_2b0 = *plVar13;
    lStack_2a8 = plVar5[3];
  }
  else {
    local_2b0 = *plVar13;
    local_2c0 = (long *)*plVar5;
  }
  local_2b8 = plVar5[1];
  *plVar5 = (long)plVar13;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_2c0);
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar14) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::genTestFunction()
{
    std::string returnString = "#ifdef TESTING\n"+
        offset(1)+"void ouputViewsForTesting()\n"+
        offset(1)+"{\n"+offset(2)+"std::ofstream ofs(\"test.out\");\n"+
        offset(2)+"ofs << std::fixed << std::setprecision(2);\n";
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);

        if (view->_origin != view->_destination)
            continue;

        std::string fields = "";
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (view->_fVars[var])
            {
                Attribute* attr = _td->getAttribute(var);
                fields += " << tuple."+attr->_name+" <<\"|\"";
            }
        }

        for (size_t agg = 0; agg < view->_aggregates.size(); ++agg)
            fields += " << tuple.aggregates["+std::to_string(agg)+"] << \"|\"";

        fields.pop_back();
        fields.pop_back();
        fields.pop_back();
        
        returnString += offset(2)+"for (size_t i=0; i < "+viewName[viewID]+
            ".size(); ++i)\n"+offset(2)+"{\n"+offset(3)+
            viewName[viewID]+"_tuple& tuple = "+viewName[viewID]+"[i];\n"+
            offset(3)+"ofs "+fields+"\"\\n\";\n"+offset(2)+"}\n";
    }

    returnString += offset(2)+"ofs.close();\n"+offset(1)+"}\n"+"#endif\n";
    return returnString;
}